

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dense.cpp
# Opt level: O3

MatrixXd * __thiscall
Dense::backward(MatrixXd *__return_storage_ptr__,Dense *this,MatrixXd *grad_output)

{
  MatrixXd *dst;
  double *pdVar1;
  int iVar2;
  char *pcVar3;
  ActualDstType actualDst;
  MatrixXd delta;
  MatrixXd delta_biases;
  MatrixXd delta_weights;
  assign_op<double,_double> local_b1;
  undefined1 local_b0 [56];
  DenseStorage<double,__1,__1,__1,_0> local_78;
  DenseStorage<double,__1,__1,__1,_0> local_58;
  DenseStorage<double,__1,__1,__1,_0> local_40;
  
  local_78.m_data = (double *)0x0;
  local_78.m_rows = 0;
  local_78.m_cols = 0;
  iVar2 = std::__cxx11::string::compare((char *)&this->type);
  if (iVar2 == 0) {
    local_b0._8_8_ = &this->activation;
    local_b0._16_8_ = activation_functions::tanh_transfer_derivative;
    if (((grad_output->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
         m_rows != (this->activation).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
        ) || ((grad_output->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
              m_storage.m_cols !=
              (this->activation).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_rows)) {
LAB_0010da60:
      local_b0._8_8_ = &this->activation;
      pcVar3 = 
      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, -1, -1>, const Eigen::Transpose<const Eigen::CwiseUnaryOp<double (*)(double), const Eigen::Matrix<double, -1, -1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_product_op<double>, Lhs = const Eigen::Matrix<double, -1, -1>, Rhs = const Eigen::Transpose<const Eigen::CwiseUnaryOp<double (*)(double), const Eigen::Matrix<double, -1, -1>>>]"
      ;
      local_b0._0_8_ = grad_output;
      goto LAB_0010db48;
    }
    local_b0._0_8_ = grad_output;
    Eigen::internal::
    call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::Transpose<Eigen::CwiseUnaryOp<double(*)(double),Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>const>,Eigen::internal::assign_op<double,double>>
              ((Matrix<double,__1,__1,_0,__1,__1> *)&local_78,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Transpose<const_Eigen::CwiseUnaryOp<double_(*)(double),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                *)local_b0,(assign_op<double,_double> *)&local_40);
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)&this->type);
    if (iVar2 == 0) {
      local_b0._8_8_ = &this->activation;
      local_b0._16_8_ = activation_functions::sigmoid_transfer_derivative;
      if (((grad_output->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
           .m_rows !=
           (this->activation).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_cols) ||
         ((grad_output->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
          m_cols != (this->activation).
                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                    m_rows)) goto LAB_0010da60;
      local_b0._0_8_ = grad_output;
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::Transpose<Eigen::CwiseUnaryOp<double(*)(double),Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>const>,Eigen::internal::assign_op<double,double>>
                ((Matrix<double,__1,__1,_0,__1,__1> *)&local_78,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Transpose<const_Eigen::CwiseUnaryOp<double_(*)(double),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                  *)local_b0,(assign_op<double,_double> *)&local_40);
    }
  }
  if ((this->weigths).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_cols == local_78.m_rows) {
    dst = &this->weigths;
    local_b0._0_8_ = dst;
    local_b0._8_8_ = &local_78;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)__return_storage_ptr__,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                *)local_b0);
    if ((this->last_input).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
        m_storage.m_rows == local_78.m_cols) {
      local_b0._0_8_ = &this->last_input;
      local_b0._8_8_ = &local_78;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      PlainObjectBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_40,
                 (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>
                  *)local_b0);
      if ((local_40.m_cols | local_40.m_rows) < 0) {
        pcVar3 = 
        "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, -1>]"
        ;
      }
      else {
        local_b0._32_8_ = *this->learning_rate;
        local_b0._16_8_ = local_40.m_rows;
        local_b0._24_8_ = local_40.m_cols;
        local_b0._8_8_ = &local_40;
        if (((_func_double_double *)
             (this->weigths).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_rows != (_func_double_double *)local_40.m_rows) ||
           ((this->weigths).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_cols != local_40.m_cols)) {
          pcVar3 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, -1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, -1, -1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, -1>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, -1, -1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1>>>]"
          ;
          local_b0._0_8_ = dst;
LAB_0010db48:
          __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/CwiseBinaryOp.h"
                        ,0x6e,pcVar3);
        }
        local_b0._0_8_ = dst;
        Eigen::internal::
        call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>const>,Eigen::internal::assign_op<double,double>>
                  (dst,(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                        *)local_b0,(assign_op<double,_double> *)&local_58);
        if (local_78.m_rows < 0) {
          pcVar3 = 
          "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
          ;
        }
        else {
          local_b0._40_8_ =
               (undefined8)
               (this->last_input).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_rows;
          local_b0._24_8_ = local_78.m_rows;
          local_58.m_data = (double *)0x0;
          local_58.m_rows = 0;
          local_58.m_cols = 0;
          local_b0._8_8_ = &local_78;
          Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                    (&local_58,local_78.m_rows,local_78.m_rows,1);
          Eigen::internal::
          call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::PartialReduxExpr<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::member_mean<double>,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>,Eigen::internal::assign_op<double,double>>
                    ((Matrix<double,__1,__1,_0,__1,__1> *)&local_58,
                     (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::PartialReduxExpr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::member_mean<double>,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      *)local_b0,&local_b1);
          if (-1 < (local_58.m_rows | local_58.m_cols)) {
            local_b0._0_8_ = &this->biases;
            local_b0._32_8_ = *this->learning_rate;
            local_b0._16_8_ = local_58.m_cols;
            local_b0._24_8_ = local_58.m_rows;
            local_b0._8_8_ = &local_58;
            if (((_func_double_double *)
                 (this->biases).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows == (_func_double_double *)local_58.m_cols) &&
               ((this->biases).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_cols == local_58.m_rows)) {
              pdVar1 = (((MatrixXd *)local_b0._0_8_)->
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                       m_data;
              if ((pdVar1 != (double *)0x0) && (local_58.m_data == pdVar1)) {
                __assert_fail("(!check_transpose_aliasing_run_time_selector <typename Derived::Scalar,blas_traits<Derived>::IsTransposed,OtherDerived> ::run(extract_data(dst), other)) && \"aliasing detected during transposition, use transposeInPlace() \" \"or evaluate the rhs into a temporary using .eval()\""
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/Transpose.h"
                              ,0x17a,
                              "static void Eigen::internal::checkTransposeAliasing_impl<Eigen::Matrix<double, -1, -1>, Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, -1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1, -1, -1>>>>>::run(const Derived &, const OtherDerived &) [Derived = Eigen::Matrix<double, -1, -1>, OtherDerived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, -1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1, -1, -1>>>>, MightHaveTransposeAliasing = true]"
                             );
              }
              Eigen::internal::
              call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const>const>,Eigen::internal::assign_op<double,double>>
                        ((Matrix<double,__1,__1,_0,__1,__1> *)local_b0._0_8_,
                         (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>_>
                          *)local_b0,&local_b1);
              free(local_58.m_data);
              free(local_40.m_data);
              free(local_78.m_data);
              return __return_storage_ptr__;
            }
            pcVar3 = 
            "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, -1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1, -1, -1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, -1>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1, -1, -1>>>]"
            ;
            goto LAB_0010db48;
          }
          pcVar3 = 
          "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, -1, 1, -1, -1>]"
          ;
        }
      }
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/CwiseNullaryOp.h"
                    ,0x4a,pcVar3);
    }
    pcVar3 = 
    "Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, Eigen::Transpose<Eigen::Matrix<double, -1, -1>>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, Rhs = Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, Option = 0]"
    ;
  }
  else {
    pcVar3 = 
    "Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Matrix<double, -1, -1>, Option = 0]"
    ;
  }
  __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/Product.h"
                ,0x61,pcVar3);
}

Assistant:

Eigen::MatrixXd Dense::backward(Eigen::MatrixXd grad_output) {
    Eigen::MatrixXd delta;
    if(type == "tanh") {
        delta = grad_output.cwiseProduct(activation.unaryExpr(&activation_functions::tanh_transfer_derivative).transpose());
    }
    else if(type == "sigmoid") {
        delta = grad_output.cwiseProduct(activation.unaryExpr(&activation_functions::sigmoid_transfer_derivative).transpose());
    }

    Eigen::MatrixXd grad_input = weigths * delta;

    Eigen::MatrixXd delta_weights = last_input.transpose() * delta.transpose();
    weigths = weigths + delta_weights * *learning_rate;

    Eigen::MatrixXd delta_biases = delta.rowwise().mean() * last_input.rows();
    biases = biases + delta_biases.transpose() * *learning_rate;

    return grad_input;
}